

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void ppc_cpu_unrealize_ppc64(CPUState *dev)

{
  TranslationBlock *pTVar1;
  opc_handler_t_conflict *poVar2;
  opc_handler_t_conflict *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
    pTVar1 = dev[3].tb_jmp_cache[lVar6 + 0xa03];
    if ((pTVar1 != (TranslationBlock *)&invalid_handler) && (((uint)pTVar1 & 3) == 1)) {
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
        poVar2 = *(opc_handler_t_conflict **)(((ulong)pTVar1 & 0xfffffffffffffffc) + lVar5 * 8);
        if ((poVar2 != &invalid_handler) && (((uint)poVar2 & 3) == 1)) {
          for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
            poVar3 = *(opc_handler_t_conflict **)(((ulong)poVar2 & 0xfffffffffffffffc) + lVar4 * 8);
            if ((poVar3 != &invalid_handler) && (((uint)poVar3 & 3) == 1)) {
              g_free((gpointer)((ulong)poVar3 & 0xfffffffffffffffc));
            }
          }
          g_free((gpointer)
                 (*(ulong *)(((ulong)pTVar1 & 0xfffffffffffffffc) + lVar5 * 8) & 0xfffffffffffffffe)
                );
        }
      }
      g_free((gpointer)((ulong)dev[3].tb_jmp_cache[lVar6 + 0xa03] & 0xfffffffffffffffe));
    }
  }
  return;
}

Assistant:

void ppc_cpu_unrealize(CPUState *dev)
{
    PowerPCCPU *cpu = POWERPC_CPU(dev);
    opc_handler_t **table, **table_2;
    int i, j, k;

    for (i = 0; i < PPC_CPU_OPCODES_LEN; i++) {
        if (cpu->opcodes[i] == &invalid_handler) {
            continue;
        }
        if (is_indirect_opcode(cpu->opcodes[i])) {
            table = ind_table(cpu->opcodes[i]);
            for (j = 0; j < PPC_CPU_INDIRECT_OPCODES_LEN; j++) {
                if (table[j] == &invalid_handler) {
                    continue;
                }
                if (is_indirect_opcode(table[j])) {
                    table_2 = ind_table(table[j]);
                    for (k = 0; k < PPC_CPU_INDIRECT_OPCODES_LEN; k++) {
                        if (table_2[k] != &invalid_handler &&
                            is_indirect_opcode(table_2[k])) {
                            g_free((opc_handler_t *)((uintptr_t)table_2[k] &
                                                     ~PPC_INDIRECT));
                        }
                    }
                    g_free((opc_handler_t *)((uintptr_t)table[j] &
                                             ~PPC_INDIRECT));
                }
            }
            g_free((opc_handler_t *)((uintptr_t)cpu->opcodes[i] &
                ~PPC_INDIRECT));
        }
    }
}